

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstack.cpp
# Opt level: O0

void __thiscall VMStack::addFrame(VMStack *this,Frame *frame)

{
  Frame *local_18;
  Frame *frame_local;
  VMStack *this_local;
  
  local_18 = frame;
  frame_local = (Frame *)this;
  std::stack<Frame_*,_std::deque<Frame_*,_std::allocator<Frame_*>_>_>::push
            (&this->_frameStack,&local_18);
  return;
}

Assistant:

void VMStack::addFrame(Frame *frame) {
    // Verifica se a stack está cheia
//    if (_frameStack.size() >= FRAME_MAX_SIZE) {
//        cerr << "StackOverflowError" << endl;
//        exit(1);
//    }
    
    _frameStack.push(frame);
}